

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O0

void __thiscall agge::tests::MiscTests::PointsSubtractionProducesVector(MiscTests *this)

{
  allocator local_289;
  string local_288 [32];
  LocationInfo local_268;
  agge_vector<int> local_23c;
  agge_vector<int> local_234;
  allocator local_229;
  string local_228 [32];
  LocationInfo local_208;
  agge_vector<int> local_1dc;
  agge_vector<int> local_1d4;
  allocator local_1c9;
  string local_1c8 [32];
  LocationInfo local_1a8;
  agge_vector<int> local_17c;
  agge_vector<int> local_174;
  allocator local_169;
  string local_168 [32];
  LocationInfo local_148;
  agge_vector<float> local_11c;
  agge_vector<float> local_114;
  allocator local_109;
  string local_108 [32];
  LocationInfo local_e8;
  agge_vector<float> local_bc;
  agge_vector<float> local_b4 [3];
  allocator local_99;
  string local_98 [32];
  LocationInfo local_78;
  agge_vector<float> local_50;
  agge_vector<float> local_48;
  point<int> local_40;
  point<int> p6;
  point<int> p5;
  point<int> p4;
  point_r p3;
  point_r p2;
  point_r p1;
  MiscTests *this_local;
  
  p2.x = -1.202;
  p2.y = 311.9;
  p3.x = 71.2;
  p3.y = -11.39;
  p4.x = 0x3e4ccccd;
  p4.y = 0x3dcccccd;
  p5.x = -9;
  p5.y = 0xd;
  p6.x = 0x38f;
  p6.y = 0x7ba;
  local_40.x = 0;
  local_40.y = 0;
  local_48 = create_vector<float>(-72.402,323.29);
  local_50 = agge::operator-(&p2,&p3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_99);
  ut::LocationInfo::LocationInfo(&local_78,(string *)local_98,0x85);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_48,&local_50,&local_78);
  ut::LocationInfo::~LocationInfo(&local_78);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  local_b4[0] = create_vector<float>(71.0,-11.49);
  local_bc = agge::operator-(&p3,(point<float> *)&p4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_109);
  ut::LocationInfo::LocationInfo(&local_e8,(string *)local_108,0x86);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(local_b4,&local_bc,&local_e8);
  ut::LocationInfo::~LocationInfo(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  local_114 = create_vector<float>(1.402,-311.8);
  local_11c = agge::operator-((point<float> *)&p4,&p2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_169);
  ut::LocationInfo::LocationInfo(&local_148,(string *)local_168,0x87);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_114,&local_11c,&local_148)
  ;
  ut::LocationInfo::~LocationInfo(&local_148);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  local_174 = create_vector<int>(-0x398,-0x7ad);
  local_17c = agge::operator-(&p5,&p6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_1c9);
  ut::LocationInfo::LocationInfo(&local_1a8,(string *)local_1c8,0x89);
  ut::are_equal<agge::agge_vector<int>,agge::agge_vector<int>>(&local_174,&local_17c,&local_1a8);
  ut::LocationInfo::~LocationInfo(&local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  local_1d4 = create_vector<int>(0x38f,0x7ba);
  local_1dc = agge::operator-(&p6,&local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_229);
  ut::LocationInfo::LocationInfo(&local_208,(string *)local_228,0x8a);
  ut::are_equal<agge::agge_vector<int>,agge::agge_vector<int>>(&local_1d4,&local_1dc,&local_208);
  ut::LocationInfo::~LocationInfo(&local_208);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  local_234 = create_vector<int>(9,-0xd);
  local_23c = agge::operator-(&local_40,&p5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_288,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_289);
  ut::LocationInfo::LocationInfo(&local_268,(string *)local_288,0x8b);
  ut::are_equal<agge::agge_vector<int>,agge::agge_vector<int>>(&local_234,&local_23c,&local_268);
  ut::LocationInfo::~LocationInfo(&local_268);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  return;
}

Assistant:

test( PointsSubtractionProducesVector )
			{
				// INIT
				const point_r p1 = { -1.202f, 311.9f }, p2 = { 71.2f, -11.39f }, p3 = { 0.2f, 0.1f };
				const point<int> p4 = { -9, 13 }, p5 = { 911, 1978 }, p6 = { 0, 0 };

				// ACT / ASSERT
				assert_equal(create_vector(-72.402f, 323.29f), p1 - p2);
				assert_equal(create_vector(71.0f, -11.49f), p2 - p3);
				assert_equal(create_vector(1.402f, -311.8f), p3 - p1);

				assert_equal(create_vector(-920, -1965), p4 - p5);
				assert_equal(create_vector(911, 1978), p5 - p6);
				assert_equal(create_vector(9, -13), p6 - p4);
			}